

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_sha1(stb_uchar *output,stb_uchar *buffer,stb_uint len)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  byte *chunk;
  byte bVar6;
  uchar final_block [128];
  stb_uint local_d8 [8];
  byte abStack_b8 [136];
  
  local_d8[0] = 0x67452301;
  local_d8[1] = 0xefcdab89;
  local_d8[2] = 0x98badcfe;
  local_d8[3] = 0x10325476;
  local_d8[4] = 0xc3d2e1f0;
  uVar2 = len & 0xffffffc0;
  uVar1 = uVar2 - 0x40;
  if ((len + 9 & 0xffffffc0) != uVar2) {
    uVar1 = uVar2;
  }
  if (uVar1 + 0x80 < len + 9) {
    __assert_fail("end_start + 128 >= len+9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18cd,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  if (0x36 < len && len <= uVar1) {
    __assert_fail("end_start < len || len < 64-9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18ce,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  uVar2 = 0;
  if (len < uVar1) {
    uVar2 = -uVar1;
  }
  for (; uVar1 + uVar2 < len; uVar2 = uVar2 + 1) {
    abStack_b8[uVar2] = buffer[uVar1 + uVar2];
  }
  bVar6 = 0x80;
  uVar2 = uVar2 + 4;
  do {
    uVar4 = uVar2;
    abStack_b8[uVar4 - 4] = bVar6;
    uVar2 = uVar4 + 1;
    bVar6 = 0;
  } while (uVar4 - 3 < 0x7b);
  abStack_b8[uVar4 - 3] = (byte)(len >> 0x1d);
  abStack_b8[uVar4 - 2] = (byte)(len >> 0x15);
  abStack_b8[uVar4 - 1] = (byte)(len >> 0xd);
  abStack_b8[uVar4] = (byte)(len >> 5);
  abStack_b8[uVar2] = (char)len << 3;
  if (uVar2 == 0x7f) {
    uVar5 = 0;
    while (uVar5 < uVar1 + 0x80) {
      if (uVar5 + 0x40 < (ulong)(uVar1 + 0x40)) {
        chunk = buffer + uVar5;
      }
      else {
        chunk = abStack_b8 + ((int)uVar5 + -uVar1);
      }
      stb__sha1(chunk,local_d8);
      uVar5 = uVar5 + 0x40;
    }
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      uVar1 = local_d8[lVar3];
      *(uint *)(output + lVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    return;
  }
  __assert_fail("j == 128 && end_start + j == final_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0x18df,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
}

Assistant:

void stb_sha1(stb_uchar output[20], stb_uchar *buffer, stb_uint len)
{
   unsigned char final_block[128];
   stb_uint end_start, final_len, j;
   int i;

   stb_uint h[5];

   h[0] = 0x67452301;
   h[1] = 0xefcdab89;
   h[2] = 0x98badcfe;
   h[3] = 0x10325476;
   h[4] = 0xc3d2e1f0;

   // we need to write padding to the last one or two
   // blocks, so build those first into 'final_block'

   // we have to write one special byte, plus the 8-byte length

   // compute the block where the data runs out
   end_start = len & ~63;

   // compute the earliest we can encode the length
   if (((len+9) & ~63) == end_start) {
      // it all fits in one block, so fill a second-to-last block
      end_start -= 64;
   }

   final_len = end_start + 128;

   // now we need to copy the data in
   assert(end_start + 128 >= len+9);
   assert(end_start < len || len < 64-9);

   j = 0;
   if (end_start > len)
      j = (stb_uint) - (int) end_start;

   for (; end_start + j < len; ++j)
      final_block[j] = buffer[end_start + j];
   final_block[j++] = 0x80;
   while (j < 128-5) // 5 byte length, so write 4 extra padding bytes
      final_block[j++] = 0;
   // big-endian size
   final_block[j++] = len >> 29;
   final_block[j++] = len >> 21;
   final_block[j++] = len >> 13;
   final_block[j++] = len >>  5;
   final_block[j++] = len <<  3;
   assert(j == 128 && end_start + j == final_len);

   for (j=0; j < final_len; j += 64) { // 512-bit chunks
      if (j+64 >= end_start+64)
         stb__sha1(&final_block[j - end_start], h);
      else
         stb__sha1(&buffer[j], h);
   }

   for (i=0; i < 5; ++i) {
      output[i*4 + 0] = h[i] >> 24;
      output[i*4 + 1] = h[i] >> 16;
      output[i*4 + 2] = h[i] >>  8;
      output[i*4 + 3] = h[i] >>  0;
   }
}